

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopl3.c
# Opt level: O1

void OPL3_ChannelSet4Op(opl3_chip *chip,uint8_t data)

{
  byte bVar1;
  ulong uVar2;
  long lVar3;
  undefined3 in_register_00000031;
  uint uVar4;
  
  uVar4 = 0;
  do {
    bVar1 = (byte)uVar4 + 6;
    if (uVar4 < 3) {
      bVar1 = (byte)uVar4;
    }
    uVar2 = (ulong)bVar1;
    lVar3 = uVar2 * 0x58;
    if ((CONCAT31(in_register_00000031,data) >> (uVar4 & 0x1f) & 1) == 0) {
      chip->channel[uVar2].chtype = '\0';
      lVar3 = uVar2 * 0x58 + 0x108;
      chip->channel[uVar2 + 3].chtype = '\0';
      OPL3_ChannelUpdateAlg(chip->channel + uVar2);
    }
    else {
      chip->channel[uVar2].chtype = '\x01';
      chip->channel[uVar2 + 3].chtype = '\x02';
    }
    OPL3_ChannelUpdateAlg((opl3_channel *)((long)chip->channel[0].slotz + lVar3));
    uVar4 = uVar4 + 1;
  } while (uVar4 != 6);
  return;
}

Assistant:

INLINE void OPL3_ChannelSet4Op(opl3_chip *chip, uint8_t data)
{
    uint8_t bit;
    uint8_t chnum;
    for (bit = 0; bit < 6; bit++)
    {
        chnum = bit;
        if (bit >= 3)
        {
            chnum += 9 - 3;
        }
        if ((data >> bit) & 0x01)
        {
            chip->channel[chnum].chtype = ch_4op;
            chip->channel[chnum + 3u].chtype = ch_4op2;
            OPL3_ChannelUpdateAlg(&chip->channel[chnum]);
        }
        else
        {
            chip->channel[chnum].chtype = ch_2op;
            chip->channel[chnum + 3u].chtype = ch_2op;
            OPL3_ChannelUpdateAlg(&chip->channel[chnum]);
            OPL3_ChannelUpdateAlg(&chip->channel[chnum + 3u]);
        }
    }
}